

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFont::setFixedPitch(QFont *this,bool enable)

{
  undefined1 *puVar1;
  byte *pbVar2;
  QFontPrivate *pQVar3;
  ulong uVar4;
  
  if (((this->resolve_mask & 0x200) == 0) ||
     (((*(ulong *)&(((this->d).d.ptr)->request).field_0x60 & 0x4000000000000) == 0) == enable)) {
    detach(this);
    uVar4 = 0;
    if (enable) {
      uVar4 = 0x4000000000000;
    }
    pQVar3 = (this->d).d.ptr;
    *(ulong *)&(pQVar3->request).field_0x60 =
         *(ulong *)&(pQVar3->request).field_0x60 & 0xfffbffffffffffff | uVar4;
    puVar1 = &(((this->d).d.ptr)->request).field_0x60;
    *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfff7ffffffffffff;
    pbVar2 = (byte *)((long)&this->resolve_mask + 1);
    *pbVar2 = *pbVar2 | 2;
  }
  return;
}

Assistant:

void QFont::setFixedPitch(bool enable)
{
    if ((resolve_mask & QFont::FixedPitchResolved) && d->request.fixedPitch == enable)
        return;

    detach();

    d->request.fixedPitch = enable;
    d->request.ignorePitch = false;
    resolve_mask |= QFont::FixedPitchResolved;
}